

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O1

int lclear(lua_State *L)

{
  void *pvVar1;
  void *__ptr;
  int *piVar2;
  int iVar3;
  long lVar4;
  
  piVar2 = (int *)lua_touserdata(L,1);
  if (piVar2 != (int *)0x0) {
    lVar4 = 0;
    do {
      __ptr = *(void **)(piVar2 + lVar4 * 2 + 4);
      while (__ptr != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        pvVar1 = *(void **)((long)__ptr + 0x10);
        free(__ptr);
        __ptr = pvVar1;
      }
      (piVar2 + lVar4 * 2 + 4)[0] = 0;
      (piVar2 + lVar4 * 2 + 4)[1] = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1000);
    iVar3 = piVar2[1];
    if (piVar2[2] < iVar3) {
      piVar2[2] = piVar2[2] + *piVar2;
    }
    if (iVar3 < piVar2[2]) {
      do {
        free(*(void **)(piVar2 + (long)(iVar3 % *piVar2) * 4 + 0x2006));
        iVar3 = iVar3 + 1;
      } while (iVar3 < piVar2[2]);
    }
    piVar2[1] = 0;
    piVar2[2] = 0;
  }
  return 0;
}

Assistant:

static int
lclear(lua_State *L) {
	struct queue * q = lua_touserdata(L, 1);
	if (q == NULL) {
		return 0;
	}
	int i;
	for (i=0;i<HASHSIZE;i++) {
		clear_list(q->hash[i]);
		q->hash[i] = NULL;
	}
	if (q->head > q->tail) {
		q->tail += q->cap;
	}
	for (i=q->head;i<q->tail;i++) {
		struct netpack *np = &q->queue[i % q->cap];
		skynet_free(np->buffer);
	}
	q->head = q->tail = 0;

	return 0;
}